

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::generateRSA
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  long lVar1;
  ulong uVar2;
  Token *pTVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  CryptoFactory *pCVar7;
  undefined4 extraout_var;
  char *pcVar8;
  long *plVar9;
  ulong in_RCX;
  undefined8 *puVar10;
  long in_RDX;
  long in_R8;
  ulong in_R9;
  bool bVar11;
  long *in_stack_00000008;
  long *in_stack_00000010;
  char in_stack_00000020;
  char in_stack_00000030;
  OSObject *ospub;
  OSObject *ospriv;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  ByteString prime1;
  ByteString privateExponent;
  ByteString publicExponent_1;
  ByteString modulus_1;
  bool bNeverExtractable;
  bool bAlwaysSensitive;
  CK_ULONG ulKeyGenMechanism_1;
  bool bOK_1;
  OSObject *osobject_1;
  CK_ULONG i_2;
  CK_ULONG privateKeyAttribsCount;
  CK_ATTRIBUTE privateKeyAttribs [32];
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  CK_ULONG maxAttribs_1;
  ByteString publicExponent;
  ByteString modulus;
  CK_ULONG ulKeyGenMechanism;
  bool bOK;
  OSObject *osobject;
  CK_ULONG i_1;
  CK_ULONG publicKeyAttribsCount;
  CK_ATTRIBUTE publicKeyAttribs [32];
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  CK_ULONG maxAttribs;
  CK_RV rv;
  RSAPrivateKey *priv;
  RSAPublicKey *pub;
  AsymmetricAlgorithm *rsa;
  AsymmetricKeyPair *kp;
  RSAParameters p;
  CK_ULONG i;
  ByteString exponent;
  size_t bitLen;
  Token *token;
  Session *session;
  ByteString *in_stack_ffffffffffffe978;
  OSAttribute *in_stack_ffffffffffffe980;
  undefined6 in_stack_ffffffffffffe990;
  undefined1 in_stack_ffffffffffffe996;
  undefined1 in_stack_ffffffffffffe997;
  uchar *in_stack_ffffffffffffe998;
  HandleManager *pHVar12;
  undefined6 in_stack_ffffffffffffe9a0;
  undefined1 in_stack_ffffffffffffe9a6;
  byte bVar13;
  undefined1 in_stack_ffffffffffffe9a7;
  HandleManager *in_stack_ffffffffffffe9a8;
  uint6 in_stack_ffffffffffffe9b0;
  undefined1 in_stack_ffffffffffffe9b6;
  byte in_stack_ffffffffffffe9b7;
  undefined6 in_stack_ffffffffffffe9c0;
  byte in_stack_ffffffffffffe9c6;
  byte in_stack_ffffffffffffe9c7;
  HandleManager *in_stack_ffffffffffffe9c8;
  byte local_162a;
  HandleManager *in_stack_ffffffffffffe9d8;
  undefined6 in_stack_ffffffffffffe9e0;
  byte in_stack_ffffffffffffe9e6;
  byte in_stack_ffffffffffffe9e7;
  byte local_160a;
  byte local_15fa;
  byte local_15e9;
  char *in_stack_ffffffffffffea38;
  ByteString *in_stack_ffffffffffffea40;
  byte local_1513;
  byte local_1503;
  byte local_14f2;
  undefined8 *local_14b8;
  byte local_149a;
  byte local_1489;
  byte local_1442;
  undefined1 *local_1408;
  OSAttribute *pOVar14;
  byte bVar15;
  undefined1 local_1300 [167];
  byte local_1259;
  undefined1 local_1258 [167];
  byte local_11b1;
  undefined1 local_11b0 [167];
  byte local_1109;
  undefined1 local_1108 [167];
  byte local_1061;
  undefined1 local_1060 [167];
  byte local_fb9;
  undefined1 local_fb8 [167];
  byte local_f11;
  undefined1 local_f10 [160];
  undefined1 local_e70 [40];
  undefined1 local_e48 [40];
  undefined1 local_e20 [40];
  undefined1 local_df8 [40];
  undefined1 local_dd0 [40];
  undefined1 local_da8 [40];
  undefined1 local_d80 [40];
  undefined1 local_d58 [47];
  byte local_d29;
  undefined1 local_d28 [92];
  int in_stack_fffffffffffff334;
  CK_OBJECT_HANDLE_PTR in_stack_fffffffffffff338;
  CK_ULONG in_stack_fffffffffffff340;
  CK_ATTRIBUTE_PTR in_stack_fffffffffffff348;
  CK_SESSION_HANDLE in_stack_fffffffffffff350;
  SoftHSM *in_stack_fffffffffffff358;
  undefined1 local_c80 [166];
  byte local_bda;
  byte local_bd9;
  undefined1 local_bd8 [160];
  undefined8 local_b38;
  byte local_b29;
  undefined1 local_b28 [167];
  byte local_a81;
  HandleManager *local_a80;
  ulong local_a78;
  long local_a70;
  undefined1 *local_a68 [5];
  undefined8 local_a40;
  undefined8 local_a38;
  undefined1 *local_a30;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined8 *local_a18;
  undefined8 local_a10;
  undefined8 local_a08 [84];
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  byte local_749;
  undefined1 local_748 [167];
  byte local_6a1;
  undefined1 local_6a0 [160];
  undefined1 local_600 [40];
  undefined1 local_5d8 [47];
  byte local_5a9;
  undefined1 local_5a8 [160];
  undefined8 local_508;
  byte local_4f9;
  undefined1 local_4f8 [167];
  byte local_451;
  long *local_450;
  ulong local_448;
  long local_440;
  undefined1 *local_438 [5];
  undefined8 local_410;
  undefined8 local_408;
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [672];
  undefined1 auStack_138 [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  CK_RV local_118;
  long *local_110;
  long *local_108;
  long *local_100;
  long *local_f8;
  RSAParameters local_f0;
  undefined4 local_90;
  ulong local_80;
  size_t local_50;
  Token *local_48;
  Session *local_40;
  ulong local_38;
  long local_30;
  ulong local_28;
  long local_20;
  CK_RV local_8;
  
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_40 = (Session *)
             HandleManager::getSession
                       (in_stack_ffffffffffffe9c8,
                        CONCAT17(in_stack_ffffffffffffe9c7,
                                 CONCAT16(in_stack_ffffffffffffe9c6,in_stack_ffffffffffffe9c0)));
  if (local_40 == (Session *)0x0) {
    local_8 = 0xb3;
  }
  else {
    local_48 = Session::getToken(local_40);
    if (local_48 == (Token *)0x0) {
      local_8 = 5;
    }
    else {
      local_50 = 0;
      ByteString::ByteString(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
      for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
        lVar1 = *(long *)(local_20 + local_80 * 0x18);
        if (lVar1 == 0x121) {
          if (*(long *)(local_20 + local_80 * 0x18 + 0x10) != 8) {
            softHSMLog(6,"generateRSA",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x20de,"CKA_MODULUS_BITS does not have the size of CK_ULONG");
            local_8 = 0x13;
            local_90 = 1;
            goto LAB_0017e7fd;
          }
          local_50 = **(size_t **)(local_20 + local_80 * 0x18 + 8);
        }
        else if (lVar1 == 0x122) {
          ByteString::ByteString
                    ((ByteString *)
                     CONCAT17(in_stack_ffffffffffffe9a7,
                              CONCAT16(in_stack_ffffffffffffe9a6,in_stack_ffffffffffffe9a0)),
                     in_stack_ffffffffffffe998,
                     CONCAT17(in_stack_ffffffffffffe997,
                              CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)));
          ByteString::operator=((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
          ByteString::~ByteString((ByteString *)0x17c68a);
        }
      }
      if (local_50 == 0) {
        softHSMLog(6,"generateRSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x20ed,"Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
        local_8 = 0xd0;
        local_90 = 1;
      }
      else {
        RSAParameters::RSAParameters
                  ((RSAParameters *)
                   CONCAT17(in_stack_ffffffffffffe997,
                            CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)));
        RSAParameters::setE((RSAParameters *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
        RSAParameters::setBitLength(&local_f0,local_50);
        local_f8 = (long *)0x0;
        pCVar7 = CryptoFactory::i();
        iVar5 = (*pCVar7->_vptr_CryptoFactory[2])(pCVar7,1);
        local_100 = (long *)CONCAT44(extraout_var,iVar5);
        if (local_100 == (long *)0x0) {
          local_8 = 5;
        }
        else {
          bVar4 = (**(code **)(*local_100 + 0x60))(local_100,&local_f8,&local_f0,0);
          if ((bVar4 & 1) == 0) {
            softHSMLog(3,"generateRSA",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x20fd,"Could not generate key pair");
            pCVar7 = CryptoFactory::i();
            (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,local_100);
            local_8 = 5;
          }
          else {
            local_108 = (long *)(**(code **)(*local_f8 + 0x18))();
            local_110 = (long *)(**(code **)(*local_f8 + 0x28))();
            local_118 = 0;
            local_120 = 0x20;
            local_128 = 2;
            local_130 = 0;
            memset(local_438,0,0x300);
            local_438[1] = (undefined1 *)&local_128;
            local_438[2] = (undefined1 *)0x8;
            local_438[3] = (undefined1 *)0x1;
            local_438[4] = &stack0x00000018;
            local_410 = 1;
            local_408 = 2;
            local_400 = &stack0x00000020;
            local_3f8 = 1;
            local_3f0 = 0x100;
            local_3e8 = &local_130;
            local_3e0 = 8;
            local_1408 = local_3d8;
            do {
              local_1408 = local_1408 + 0x18;
            } while (local_1408 != auStack_138);
            local_440 = 4;
            if (0x1c < local_28) {
              local_118 = 0xd1;
            }
            for (local_448 = 0; local_448 < local_28 && local_118 == 0; local_448 = local_448 + 1) {
              uVar2 = *(ulong *)(local_20 + local_448 * 0x18);
              if (((2 < uVar2) && (uVar2 != 0x100)) && (uVar2 != 0x122)) {
                puVar10 = (undefined8 *)(local_20 + local_448 * 0x18);
                local_438[local_440 * 3] = (undefined1 *)*puVar10;
                local_438[local_440 * 3 + 1] = (undefined1 *)puVar10[1];
                local_438[local_440 * 3 + 2] = (undefined1 *)puVar10[2];
                local_440 = local_440 + 1;
              }
            }
            if (local_118 == 0) {
              local_118 = CreateObject(in_stack_fffffffffffff358,in_stack_fffffffffffff350,
                                       in_stack_fffffffffffff348,in_stack_fffffffffffff340,
                                       in_stack_fffffffffffff338,in_stack_fffffffffffff334);
            }
            if (local_118 == 0) {
              local_450 = (long *)HandleManager::getObject
                                            (in_stack_ffffffffffffe9c8,
                                             CONCAT17(in_stack_ffffffffffffe9c7,
                                                      CONCAT16(in_stack_ffffffffffffe9c6,
                                                               in_stack_ffffffffffffe9c0)));
              if ((local_450 == (long *)0x0) ||
                 (bVar4 = (**(code **)(*local_450 + 0x50))(), (bVar4 & 1) == 0)) {
                local_118 = 6;
              }
              else {
                bVar4 = (**(code **)(*local_450 + 0x58))();
                plVar9 = local_450;
                if ((bVar4 & 1) == 0) {
                  local_118 = 6;
                }
                else {
                  local_451 = 1;
                  local_4f9 = 0;
                  OSAttribute::OSAttribute
                            (in_stack_ffffffffffffe980,
                             SUB81((ulong)in_stack_ffffffffffffe978 >> 0x38,0));
                  local_4f9 = 1;
                  local_451 = (**(code **)(*plVar9 + 0x40))(plVar9,0x163,local_4f8);
                  local_451 = local_451 & 1;
                  if ((local_4f9 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                  }
                  plVar9 = local_450;
                  local_508 = 0;
                  local_5a9 = 0;
                  local_1442 = 0;
                  if ((local_451 & 1) != 0) {
                    OSAttribute::OSAttribute
                              (in_stack_ffffffffffffe980,(unsigned_long)in_stack_ffffffffffffe978);
                    local_5a9 = 1;
                    local_1442 = (**(code **)(*plVar9 + 0x40))(plVar9,0x166,local_5a8);
                  }
                  local_451 = local_1442 & 1;
                  if ((local_5a9 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                  }
                  ByteString::ByteString((ByteString *)0x17cdd0);
                  ByteString::ByteString((ByteString *)0x17cddf);
                  pTVar3 = local_48;
                  if (in_stack_00000020 == '\0') {
                    (**(code **)(*local_108 + 0x40))();
                    ByteString::operator=
                              ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                    (**(code **)(*local_108 + 0x48))();
                    ByteString::operator=
                              ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                  }
                  else {
                    pcVar8 = (char *)(**(code **)(*local_108 + 0x40))();
                    Token::encrypt(pTVar3,pcVar8,(int)local_5d8);
                    pTVar3 = local_48;
                    pcVar8 = (char *)(**(code **)(*local_108 + 0x48))();
                    Token::encrypt(pTVar3,pcVar8,(int)local_600);
                  }
                  plVar9 = local_450;
                  local_6a1 = 0;
                  local_1489 = 0;
                  if ((local_451 & 1) != 0) {
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_ffffffffffffe9b7,
                                        CONCAT16(in_stack_ffffffffffffe9b6,in_stack_ffffffffffffe9b0
                                                )),(ByteString *)in_stack_ffffffffffffe9a8);
                    local_6a1 = 1;
                    local_1489 = (**(code **)(*plVar9 + 0x40))(plVar9,0x120,local_6a0);
                  }
                  local_451 = local_1489 & 1;
                  if ((local_6a1 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                  }
                  plVar9 = local_450;
                  local_749 = 0;
                  local_149a = 0;
                  if ((local_451 & 1) != 0) {
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_ffffffffffffe9b7,
                                        CONCAT16(in_stack_ffffffffffffe9b6,in_stack_ffffffffffffe9b0
                                                )),(ByteString *)in_stack_ffffffffffffe9a8);
                    local_749 = 1;
                    local_149a = (**(code **)(*plVar9 + 0x40))(plVar9,0x122,local_748);
                  }
                  local_451 = local_149a & 1;
                  if ((local_749 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                  }
                  if ((local_451 & 1) == 0) {
                    (**(code **)(*local_450 + 0x68))();
                  }
                  else {
                    local_451 = (**(code **)(*local_450 + 0x60))();
                    local_451 = local_451 & 1;
                  }
                  if ((local_451 & 1) == 0) {
                    local_118 = 6;
                  }
                  ByteString::~ByteString((ByteString *)0x17d1ac);
                  ByteString::~ByteString((ByteString *)0x17d1b9);
                }
              }
            }
            if (local_118 == 0) {
              local_758 = 0x20;
              local_760 = 3;
              local_768 = 0;
              memset(local_a68,0,0x300);
              local_a68[1] = (undefined1 *)&local_760;
              local_a68[2] = (undefined1 *)0x8;
              local_a68[3] = (undefined1 *)0x1;
              local_a68[4] = &stack0x00000028;
              local_a40 = 1;
              local_a38 = 2;
              local_a30 = &stack0x00000030;
              local_a28 = 1;
              local_a20 = 0x100;
              local_a18 = &local_768;
              local_a10 = 8;
              local_14b8 = local_a08;
              do {
                local_14b8 = local_14b8 + 3;
              } while (local_14b8 != &local_768);
              local_a70 = 4;
              if (0x1c < local_38) {
                local_118 = 0xd1;
              }
              for (local_a78 = 0; local_a78 < local_38 && local_118 == 0; local_a78 = local_a78 + 1)
              {
                uVar2 = *(ulong *)(local_30 + local_a78 * 0x18);
                if ((2 < uVar2) && (uVar2 != 0x100)) {
                  puVar10 = (undefined8 *)(local_30 + local_a78 * 0x18);
                  local_a68[local_a70 * 3] = (undefined1 *)*puVar10;
                  local_a68[local_a70 * 3 + 1] = (undefined1 *)puVar10[1];
                  local_a68[local_a70 * 3 + 2] = (undefined1 *)puVar10[2];
                  local_a70 = local_a70 + 1;
                }
              }
              if (local_118 == 0) {
                local_118 = CreateObject(in_stack_fffffffffffff358,in_stack_fffffffffffff350,
                                         in_stack_fffffffffffff348,in_stack_fffffffffffff340,
                                         in_stack_fffffffffffff338,in_stack_fffffffffffff334);
              }
              if (local_118 == 0) {
                local_a80 = (HandleManager *)
                            HandleManager::getObject
                                      (in_stack_ffffffffffffe9c8,
                                       CONCAT17(in_stack_ffffffffffffe9c7,
                                                CONCAT16(in_stack_ffffffffffffe9c6,
                                                         in_stack_ffffffffffffe9c0)));
                if ((local_a80 == (HandleManager *)0x0) ||
                   (uVar6 = (*local_a80->_vptr_HandleManager[10])(), (uVar6 & 1) == 0)) {
                  local_118 = 6;
                }
                else {
                  uVar6 = (*local_a80->_vptr_HandleManager[0xb])(local_a80,1);
                  pHVar12 = local_a80;
                  if ((uVar6 & 1) == 0) {
                    local_118 = 6;
                  }
                  else {
                    local_a81 = 1;
                    local_b29 = 0;
                    OSAttribute::OSAttribute
                              (in_stack_ffffffffffffe980,
                               SUB81((ulong)in_stack_ffffffffffffe978 >> 0x38,0));
                    local_b29 = 1;
                    iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x163,local_b28);
                    local_a81 = (byte)iVar5 & 1;
                    if ((local_b29 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    pHVar12 = local_a80;
                    local_b38 = 0;
                    local_bd9 = 0;
                    local_14f2 = 0;
                    if ((local_a81 & 1) != 0) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffe980,(unsigned_long)in_stack_ffffffffffffe978)
                      ;
                      local_bd9 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x166,local_bd8);
                      local_14f2 = (byte)iVar5;
                    }
                    local_a81 = local_14f2 & 1;
                    if ((local_bd9 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    iVar5 = (*local_a80->_vptr_HandleManager[4])(local_a80,0x103,0);
                    pHVar12 = local_a80;
                    local_bda = (byte)iVar5 & 1;
                    bVar11 = (local_a81 & 1) != 0;
                    local_1503 = 0;
                    if (bVar11) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffe980,
                                 SUB81((ulong)in_stack_ffffffffffffe978 >> 0x38,0));
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x165,local_c80);
                      local_1503 = (byte)iVar5;
                    }
                    local_a81 = local_1503 & 1;
                    if (bVar11) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    (*local_a80->_vptr_HandleManager[4])(local_a80,0x162,0);
                    pHVar12 = local_a80;
                    local_d29 = 0;
                    local_1513 = 0;
                    if ((local_a81 & 1) != 0) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffe980,
                                 SUB81((ulong)in_stack_ffffffffffffe978 >> 0x38,0));
                      local_d29 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x164,local_d28);
                      local_1513 = (byte)iVar5;
                    }
                    local_a81 = local_1513 & 1;
                    if ((local_d29 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    ByteString::ByteString((ByteString *)0x17d886);
                    ByteString::ByteString((ByteString *)0x17d895);
                    ByteString::ByteString((ByteString *)0x17d8a4);
                    ByteString::ByteString((ByteString *)0x17d8b3);
                    ByteString::ByteString((ByteString *)0x17d8c2);
                    ByteString::ByteString((ByteString *)0x17d8d1);
                    ByteString::ByteString((ByteString *)0x17d8e0);
                    ByteString::ByteString((ByteString *)0x17d8ef);
                    pTVar3 = local_48;
                    if (in_stack_00000030 == '\0') {
                      (**(code **)(*local_110 + 0xb0))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0xb8))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0xa8))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0x80))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0x88))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0x98))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0xa0))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                      (**(code **)(*local_110 + 0x90))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
                    }
                    else {
                      pcVar8 = (char *)(**(code **)(*local_110 + 0xb0))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_d58);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0xb8))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_d80);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0xa8))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_da8);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0x80))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_dd0);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0x88))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_df8);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0x98))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_e20);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0xa0))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_e48);
                      pTVar3 = local_48;
                      pcVar8 = (char *)(**(code **)(*local_110 + 0x90))();
                      Token::encrypt(pTVar3,pcVar8,(int)local_e70);
                    }
                    pHVar12 = local_a80;
                    local_f11 = 0;
                    local_15e9 = 0;
                    if ((local_a81 & 1) != 0) {
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(in_stack_ffffffffffffe9b6,
                                                   in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      local_f11 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x120,local_f10);
                      local_15e9 = (byte)iVar5;
                    }
                    local_a81 = local_15e9 & 1;
                    if ((local_f11 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    pHVar12 = local_a80;
                    local_fb9 = 0;
                    local_15fa = 0;
                    if ((local_a81 & 1) != 0) {
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(in_stack_ffffffffffffe9b6,
                                                   in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      local_fb9 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x122,local_fb8);
                      local_15fa = (byte)iVar5;
                    }
                    local_a81 = local_15fa & 1;
                    if ((local_fb9 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    pHVar12 = local_a80;
                    local_1061 = 0;
                    local_160a = 0;
                    if ((local_a81 & 1) != 0) {
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(in_stack_ffffffffffffe9b6,
                                                   in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      local_1061 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x123,local_1060);
                      in_stack_ffffffffffffe9e7 = (byte)iVar5;
                      local_160a = in_stack_ffffffffffffe9e7;
                    }
                    local_a81 = local_160a & 1;
                    if ((local_1061 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    local_1109 = 0;
                    in_stack_ffffffffffffe9e6 = 0;
                    if ((local_a81 & 1) != 0) {
                      in_stack_ffffffffffffe9d8 = local_a80;
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(in_stack_ffffffffffffe9b6,
                                                   in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      local_1109 = 1;
                      iVar5 = (*in_stack_ffffffffffffe9d8->_vptr_HandleManager[8])
                                        (in_stack_ffffffffffffe9d8,0x124,local_1108);
                      in_stack_ffffffffffffe9e6 = (byte)iVar5;
                    }
                    local_a81 = in_stack_ffffffffffffe9e6 & 1;
                    if ((local_1109 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    local_11b1 = 0;
                    local_162a = 0;
                    if ((local_a81 & 1) != 0) {
                      in_stack_ffffffffffffe9c8 = local_a80;
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(in_stack_ffffffffffffe9b6,
                                                   in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      local_11b1 = 1;
                      iVar5 = (*in_stack_ffffffffffffe9c8->_vptr_HandleManager[8])
                                        (in_stack_ffffffffffffe9c8,0x125,local_11b0);
                      in_stack_ffffffffffffe9c7 = (byte)iVar5;
                      local_162a = in_stack_ffffffffffffe9c7;
                    }
                    local_a81 = local_162a & 1;
                    if ((local_11b1 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    pHVar12 = local_a80;
                    local_1259 = 0;
                    in_stack_ffffffffffffe9c6 = 0;
                    if ((local_a81 & 1) != 0) {
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(in_stack_ffffffffffffe9b6,
                                                   in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      local_1259 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])(pHVar12,0x126,local_1258);
                      in_stack_ffffffffffffe9b7 = (byte)iVar5;
                      in_stack_ffffffffffffe9c6 = in_stack_ffffffffffffe9b7;
                    }
                    local_a81 = in_stack_ffffffffffffe9c6 & 1;
                    if ((local_1259 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    bVar11 = (local_a81 & 1) != 0;
                    bVar4 = 0;
                    if (bVar11) {
                      in_stack_ffffffffffffe9a8 = local_a80;
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,(uint7)in_stack_ffffffffffffe9b0
                                         ),(ByteString *)local_a80);
                      iVar5 = (*in_stack_ffffffffffffe9a8->_vptr_HandleManager[8])
                                        (in_stack_ffffffffffffe9a8,0x127,local_1300);
                      bVar4 = (byte)iVar5;
                    }
                    local_a81 = bVar4 & 1;
                    if (bVar11) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    bVar15 = 0;
                    bVar13 = 0;
                    if ((local_a81 & 1) != 0) {
                      pHVar12 = local_a80;
                      OSAttribute::OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_ffffffffffffe9b7,
                                          CONCAT16(bVar4,in_stack_ffffffffffffe9b0)),
                                 (ByteString *)in_stack_ffffffffffffe9a8);
                      bVar15 = 1;
                      iVar5 = (*pHVar12->_vptr_HandleManager[8])
                                        (pHVar12,0x128,&stack0xffffffffffffec58);
                      bVar13 = (byte)iVar5;
                    }
                    local_a81 = bVar13 & 1;
                    if ((bVar15 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffe980);
                    }
                    if ((local_a81 & 1) == 0) {
                      (*local_a80->_vptr_HandleManager[0xd])();
                    }
                    else {
                      iVar5 = (*local_a80->_vptr_HandleManager[0xc])();
                      local_a81 = (byte)iVar5 & 1;
                    }
                    if ((local_a81 & 1) == 0) {
                      local_118 = 6;
                    }
                    ByteString::~ByteString((ByteString *)0x17e581);
                    ByteString::~ByteString((ByteString *)0x17e58e);
                    ByteString::~ByteString((ByteString *)0x17e59b);
                    ByteString::~ByteString((ByteString *)0x17e5a8);
                    ByteString::~ByteString((ByteString *)0x17e5b5);
                    ByteString::~ByteString((ByteString *)0x17e5c2);
                    ByteString::~ByteString((ByteString *)0x17e5cf);
                    ByteString::~ByteString((ByteString *)0x17e5dc);
                  }
                }
              }
            }
            (**(code **)(*local_100 + 0xc0))(local_100,local_f8);
            pCVar7 = CryptoFactory::i();
            (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,local_100);
            if (local_118 != 0) {
              if (*in_stack_00000010 != 0) {
                in_stack_ffffffffffffe980 =
                     (OSAttribute *)
                     HandleManager::getObject
                               (in_stack_ffffffffffffe9c8,
                                CONCAT17(in_stack_ffffffffffffe9c7,
                                         CONCAT16(in_stack_ffffffffffffe9c6,
                                                  in_stack_ffffffffffffe9c0)));
                pOVar14 = in_stack_ffffffffffffe980;
                HandleManager::destroyObject
                          ((HandleManager *)
                           CONCAT17(in_stack_ffffffffffffe9e7,
                                    CONCAT16(in_stack_ffffffffffffe9e6,in_stack_ffffffffffffe9e0)),
                           (CK_OBJECT_HANDLE)in_stack_ffffffffffffe9d8);
                if (pOVar14 != (OSAttribute *)0x0) {
                  (*(((AsymmetricParameters *)&pOVar14->_vptr_OSAttribute)->super_Serialisable).
                    _vptr_Serialisable[0xe])();
                }
                *in_stack_00000010 = 0;
              }
              if (*in_stack_00000008 != 0) {
                plVar9 = (long *)HandleManager::getObject
                                           (in_stack_ffffffffffffe9c8,
                                            CONCAT17(in_stack_ffffffffffffe9c7,
                                                     CONCAT16(in_stack_ffffffffffffe9c6,
                                                              in_stack_ffffffffffffe9c0)));
                HandleManager::destroyObject
                          ((HandleManager *)
                           CONCAT17(in_stack_ffffffffffffe9e7,
                                    CONCAT16(in_stack_ffffffffffffe9e6,in_stack_ffffffffffffe9e0)),
                           (CK_OBJECT_HANDLE)in_stack_ffffffffffffe9d8);
                if (plVar9 != (long *)0x0) {
                  (**(code **)(*plVar9 + 0x70))();
                }
                *in_stack_00000008 = 0;
              }
            }
            local_8 = local_118;
          }
        }
        local_90 = 1;
        RSAParameters::~RSAParameters((RSAParameters *)in_stack_ffffffffffffe980);
      }
LAB_0017e7fd:
      ByteString::~ByteString((ByteString *)0x17e80a);
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::generateRSA
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate
)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information: bitlen and public exponent
	size_t bitLen = 0;
	ByteString exponent("010001");
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_MODULUS_BITS:
				if (pPublicKeyTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_MODULUS_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pPublicKeyTemplate[i].pValue;
				break;
			case CKA_PUBLIC_EXPONENT:
				exponent = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// CKA_MODULUS_BITS must be specified to be able to generate a key pair.
	if (bitLen == 0) {
		INFO_MSG("Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	RSAParameters p;
	p.setE(exponent);
	p.setBitLength(bitLen);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* rsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
	if (rsa == NULL)
		return CKR_GENERAL_ERROR;
	if (!rsa->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);
		return CKR_GENERAL_ERROR;
	}

	RSAPublicKey* pub = (RSAPublicKey*) kp->getPublicKey();
	RSAPrivateKey* priv = (RSAPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_RSA;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
				case CKA_PUBLIC_EXPONENT:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// RSA Public Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getN(), modulus);
					token->encrypt(pub->getE(), publicExponent);
				}
				else
				{
					modulus = pub->getN();
					publicExponent = pub->getE();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_RSA;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// RSA Private Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				ByteString privateExponent;
				ByteString prime1;
				ByteString prime2;
				ByteString exponent1;
				ByteString exponent2;
				ByteString coefficient;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getN(), modulus);
					token->encrypt(priv->getE(), publicExponent);
					token->encrypt(priv->getD(), privateExponent);
					token->encrypt(priv->getP(), prime1);
					token->encrypt(priv->getQ(), prime2);
					token->encrypt(priv->getDP1(), exponent1);
					token->encrypt(priv->getDQ1(), exponent2);
					token->encrypt(priv->getPQ(), coefficient);
				}
				else
				{
					modulus = priv->getN();
					publicExponent = priv->getE();
					privateExponent = priv->getD();
					prime1 = priv->getP();
					prime2 = priv->getQ();
					exponent1 =  priv->getDP1();
					exponent2 = priv->getDQ1();
					coefficient = priv->getPQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIVATE_EXPONENT, privateExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_1, prime1);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_2, prime2);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_1,exponent1);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_2, exponent2);
				bOK = bOK && osobject->setAttribute(CKA_COEFFICIENT, coefficient);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	rsa->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}